

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConeTwistConstraint.h
# Opt level: O2

char * __thiscall
btConeTwistConstraint::serialize
          (btConeTwistConstraint *this,void *dataBuffer,btSerializer *serializer)

{
  btScalar bVar1;
  btScalar bVar2;
  btScalar bVar3;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  btTransform::serialize(&this->m_rbAFrame,(btTransformFloatData *)((long)dataBuffer + 0x40));
  btTransform::serialize(&this->m_rbBFrame,(btTransformFloatData *)((long)dataBuffer + 0x80));
  bVar2 = this->m_swingSpan2;
  bVar3 = this->m_twistSpan;
  bVar1 = this->m_limitSoftness;
  *(btScalar *)((long)dataBuffer + 0xc0) = this->m_swingSpan1;
  *(btScalar *)((long)dataBuffer + 0xc4) = bVar2;
  *(btScalar *)((long)dataBuffer + 200) = bVar3;
  *(btScalar *)((long)dataBuffer + 0xcc) = bVar1;
  *(undefined8 *)((long)dataBuffer + 0xd0) = *(undefined8 *)&this->m_biasFactor;
  *(btScalar *)((long)dataBuffer + 0xd8) = this->m_damping;
  return "btConeTwistConstraintData";
}

Assistant:

SIMD_FORCE_INLINE const char*	btConeTwistConstraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btConeTwistConstraintData2* cone = (btConeTwistConstraintData2*) dataBuffer;
	btTypedConstraint::serialize(&cone->m_typeConstraintData,serializer);

	m_rbAFrame.serialize(cone->m_rbAFrame);
	m_rbBFrame.serialize(cone->m_rbBFrame);
	
	cone->m_swingSpan1 = m_swingSpan1;
	cone->m_swingSpan2 = m_swingSpan2;
	cone->m_twistSpan = m_twistSpan;
	cone->m_limitSoftness = m_limitSoftness;
	cone->m_biasFactor = m_biasFactor;
	cone->m_relaxationFactor = m_relaxationFactor;
	cone->m_damping = m_damping;

	return btConeTwistConstraintDataName;
}